

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>,_true>
 __thiscall
duckdb::UncompressedStringStorage::StringInitSegment
          (UncompressedStringStorage *this,ColumnSegment *segment,block_id_t block_id,
          optional_ptr<duckdb::ColumnSegmentState,_true> segment_state)

{
  BufferManager *pBVar1;
  idx_t iVar2;
  ColumnSegmentState *pCVar3;
  pointer pUVar4;
  BufferHandle handle;
  BufferHandle local_40;
  optional_ptr<duckdb::ColumnSegmentState,_true> local_28;
  
  local_28.ptr = segment_state.ptr;
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  if (block_id == -1) {
    (*pBVar1->_vptr_BufferManager[7])(&local_40,pBVar1,&segment->block);
    iVar2 = ColumnSegment::SegmentSize(segment);
    SetDictionary(segment,&local_40,(StringDictionaryContainer)(iVar2 << 0x20));
    BufferHandle::~BufferHandle(&local_40);
  }
  make_uniq<duckdb::UncompressedStringSegmentState>();
  if (segment_state.ptr != (ColumnSegmentState *)0x0) {
    pCVar3 = optional_ptr<duckdb::ColumnSegmentState,_true>::operator->(&local_28);
    pUVar4 = unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
             ::operator->((unique_ptr<duckdb::UncompressedStringSegmentState,_std::default_delete<duckdb::UncompressedStringSegmentState>,_true>
                           *)&local_40);
    ::std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&(pUVar4->on_disk_blocks).super_vector<long,_std::allocator<long>_>,&pCVar3->blocks);
  }
  *(element_type **)this =
       local_40.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  return (unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
          )(unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
            )this;
}

Assistant:

unique_ptr<CompressedSegmentState>
UncompressedStringStorage::StringInitSegment(ColumnSegment &segment, block_id_t block_id,
                                             optional_ptr<ColumnSegmentState> segment_state) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	if (block_id == INVALID_BLOCK) {
		auto handle = buffer_manager.Pin(segment.block);
		StringDictionaryContainer dictionary;
		dictionary.size = 0;
		dictionary.end = UnsafeNumericCast<uint32_t>(segment.SegmentSize());
		SetDictionary(segment, handle, dictionary);
	}
	auto result = make_uniq<UncompressedStringSegmentState>();
	if (segment_state) {
		auto &serialized_state = segment_state->Cast<SerializedStringSegmentState>();
		result->on_disk_blocks = std::move(serialized_state.blocks);
	}
	return std::move(result);
}